

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

iterator mapFdAcByIdx(int idx)

{
  bool bVar1;
  pointer ppVar2;
  int in_EDI;
  int i;
  lock_guard<std::mutex> lock;
  iterator fdIter;
  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  _Self local_28;
  int local_1c;
  int local_c;
  _Self local_8;
  
  local_c = in_EDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
             ,(mutex_type *)in_stack_ffffffffffffffb8);
  local_1c = 0;
  local_8._M_node =
       (_Base_ptr)
       std::
       map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(&local_8,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::
             operator->((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *)
                        CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc7 = LTFlightData::hasAc(&ppVar2->second);
    if (((bool)in_stack_ffffffffffffffc7) && (local_1c = local_1c + 1, local_1c == local_c))
    goto LAB_001e0eff;
    std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  local_8._M_node =
       (_Base_ptr)
       std::
       map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
       ::end(in_stack_ffffffffffffffb8);
LAB_001e0eff:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1e0f09);
  return (iterator)local_8._M_node;
}

Assistant:

mapLTFlightDataTy::iterator mapFdAcByIdx (int idx)
{
    // access guarded by the fd mutex
    std::lock_guard<std::mutex> lock (mapFdMutex);
    // let's find the i-th aircraft by looping over all flight data
    // and count those objects, which have an a/c
    int i = 0;
    for (mapLTFlightDataTy::iterator fdIter = mapFd.begin();
         fdIter != mapFd.end();
         ++fdIter)
    {
        if (fdIter->second.hasAc())         // has an a/c
            if ( ++i == idx )               // and it's the i-th!
                return fdIter;
    }
    
    // not found
    return mapFd.end();
}